

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O1

void __thiscall miniros::TopicManager::getPublications(TopicManager *this,XmlRpcValue *pubs)

{
  pointer psVar1;
  element_type *value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  XmlRpcValue *pXVar3;
  pointer psVar4;
  XmlRpcValue pub;
  XmlRpcValue local_50;
  XmlRpcValue local_40;
  
  XmlRpc::XmlRpcValue::assertArray(pubs,0);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->advertised_topics_mutex_);
  if (iVar2 == 0) {
    psVar4 = (this->advertised_topics_).
             super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->advertised_topics_).
             super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar1) {
      iVar2 = 0;
      do {
        value = (psVar4->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
        this_00 = (psVar4->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_50._type = TypeInvalid;
        local_50._value.asDouble = 0.0;
        XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&value->name_);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_50,0);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_40);
        XmlRpc::XmlRpcValue::invalidate(&local_40);
        XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&value->datatype_);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](&local_50,1);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_40);
        XmlRpc::XmlRpcValue::invalidate(&local_40);
        pXVar3 = XmlRpc::XmlRpcValue::operator[](pubs,iVar2);
        XmlRpc::XmlRpcValue::operator=(pXVar3,&local_50);
        XmlRpc::XmlRpcValue::invalidate(&local_50);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar4 = psVar4 + 1;
        iVar2 = iVar2 + 1;
      } while (psVar4 != psVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->advertised_topics_mutex_);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void TopicManager::getPublications(XmlRpcValue& pubs)
{
  // force these guys to be arrays, even if we don't populate them
  pubs.setSize(0);

  {
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);

    uint32_t sidx = 0;

    for (PublicationPtr t: advertised_topics_) {
      XmlRpcValue pub;
      pub[0] = t->getName();
      pub[1] = t->getDataType();
      pubs[sidx++] = pub;
    }
  }
}